

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatHermitianTransposeVec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  if (*(int *)(*in_RDI + 0x28) == 0) {
    MatTransposeVec_SparseCSC(A,x,y);
  }
  else {
    MatTransposeVec_SparseCSR(A,x,y);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    SUNCheckCall(MatTransposeVec_SparseCSC(A, x, y));
  }
  else { SUNCheckCall(MatTransposeVec_SparseCSR(A, x, y)); }

  return SUN_SUCCESS;
}